

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3MessageSetWireFormat_Test::
~ValidationErrorTest_ValidateProto3MessageSetWireFormat_Test
          (ValidationErrorTest_ValidateProto3MessageSetWireFormat_Test *this)

{
  ValidationErrorTest_ValidateProto3MessageSetWireFormat_Test *this_local;
  
  ~ValidationErrorTest_ValidateProto3MessageSetWireFormat_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3MessageSetWireFormat) {
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  options { message_set_wire_format: true } "
      "}",
      "foo.proto: Foo: NAME: MessageSet is not supported "
      "in proto3.\n");
}